

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

bool __thiscall
QAbstractItemViewPrivate::droppingOnItself
          (QAbstractItemViewPrivate *this,QDropEvent *event,QModelIndex *index)

{
  int iVar1;
  QAbstractItemView *this_00;
  int *piVar2;
  undefined8 uVar3;
  char cVar4;
  DragDropMode DVar5;
  QAbstractItemView *pQVar6;
  qsizetype qVar7;
  long in_FS_OFFSET;
  bool bVar8;
  long local_90;
  quintptr local_88;
  QAbstractItemModel *pQStack_80;
  QModelIndex local_78;
  QList<QModelIndex> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemView **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  iVar1 = *(int *)(event + 0x2c);
  DVar5 = QAbstractItemView::dragDropMode(this_00);
  pQVar6 = (QAbstractItemView *)QDropEvent::source();
  if (pQVar6 == this_00) {
    bVar8 = false;
    if ((((byte)event[0x28] & 2) == 0) || (DVar5 != InternalMove && iVar1 != 2)) goto LAB_0053ee8a;
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d._0_4_ = 0xaaaaaaaa;
    local_58.d.d._4_4_ = 0xaaaaaaaa;
    local_58.d.ptr._0_4_ = 0xaaaaaaaa;
    local_58.d.ptr._4_4_ = 0xaaaaaaaa;
    (**(code **)(*(long *)this_00 + 0x2d8))(&local_58,this_00);
    local_78.r = index->r;
    local_78.c = index->c;
    local_78.i = index->i;
    local_78.m.ptr = (index->m).ptr;
    if ((-1 < local_78.r) &&
       ((-1 < (long)local_78._0_8_ && (local_78.m.ptr != (QAbstractItemModel *)0x0)))) {
      while( true ) {
        cVar4 = comparesEqual(&this->root,&local_78);
        if (cVar4 != '\0') break;
        qVar7 = QtPrivate::indexOf<QModelIndex,QModelIndex>(&local_58,&local_78,0);
        if (qVar7 != -1) {
          piVar2 = (int *)CONCAT44(local_58.d.d._4_4_,local_58.d.d._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              QArrayData::deallocate
                        ((QArrayData *)CONCAT44(local_58.d.d._4_4_,local_58.d.d._0_4_),0x18,0x10);
            }
          }
          bVar8 = true;
          goto LAB_0053ee8a;
        }
        if (local_78.m.ptr == (QAbstractItemModel *)0x0) {
          local_90 = -1;
          local_88 = 0;
          pQStack_80 = (QAbstractItemModel *)0x0;
        }
        else {
          (**(code **)(*(long *)local_78.m.ptr + 0x68))(&local_90,local_78.m.ptr,&local_78);
        }
        local_78.m.ptr = pQStack_80;
        local_78.r = (undefined4)local_90;
        local_78.c = local_90._4_4_;
        uVar3 = local_78._0_8_;
        local_78.i = local_88;
        local_78.r = (int)local_90;
        bVar8 = local_78.r < 0;
        local_78._0_8_ = uVar3;
        if (((bVar8) || (local_90 < 0)) || (pQStack_80 == (QAbstractItemModel *)0x0)) break;
      }
    }
    piVar2 = (int *)CONCAT44(local_58.d.d._4_4_,local_58.d.d._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate
                  ((QArrayData *)CONCAT44(local_58.d.d._4_4_,local_58.d.d._0_4_),0x18,0x10);
      }
    }
  }
  bVar8 = false;
LAB_0053ee8a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar8;
  }
  __stack_chk_fail();
}

Assistant:

bool QAbstractItemViewPrivate::droppingOnItself(QDropEvent *event, const QModelIndex &index)
{
    Q_Q(QAbstractItemView);
    Qt::DropAction dropAction = event->dropAction();
    if (q->dragDropMode() == QAbstractItemView::InternalMove)
        dropAction = Qt::MoveAction;
    if (event->source() == q
        && event->possibleActions() & Qt::MoveAction
        && dropAction == Qt::MoveAction) {
        QModelIndexList selectedIndexes = q->selectedIndexes();
        QModelIndex child = index;
        while (child.isValid() && child != root) {
            if (selectedIndexes.contains(child))
                return true;
            child = child.parent();
        }
    }
    return false;
}